

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void xc_bspline(int i,int p,double u,int nderiv,double *U,double *ders)

{
  size_t __n;
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  size_t __n_00;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double ND [5];
  double N [8] [8];
  void ****local_278;
  ulong local_270;
  double local_268 [6];
  double local_238 [8];
  undefined1 local_1f8 [456];
  
  __n = (long)nderiv * 8 + 8;
  memset(ders,0,__n);
  dVar14 = U[i];
  if ((dVar14 <= u) && (uVar5 = i + p, uVar4 = (ulong)uVar5, u < U[(long)(int)uVar5 + 1])) {
    memset(local_238,0,0x200);
    if (-1 < p) {
      uVar2 = 0;
      do {
        dVar15 = 0.0;
        if (U[(long)i + uVar2] <= u) {
          dVar15 = (double)(-(ulong)(u < U[(long)i + uVar2 + 1]) & 0x3ff0000000000000);
        }
        local_238[uVar2] = dVar15;
        uVar2 = uVar2 + 1;
      } while (p + 1 != uVar2);
    }
    if (0 < p) {
      pdVar3 = U + (long)i + 2;
      uVar2 = 1;
      puVar7 = local_1f8;
      uVar9 = p;
      do {
        dVar15 = local_238[uVar2 * 8 + -8];
        dVar16 = 0.0;
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          dVar16 = (dVar15 * (u - dVar14)) / (U[(long)i + uVar2] - dVar14);
        }
        if (uVar2 <= (uint)p) {
          uVar11 = 0;
          do {
            dVar15 = *(double *)(puVar7 + uVar11 * 8 + -0x38);
            if ((dVar15 != 0.0) || (NAN(dVar15))) {
              dVar1 = U[(long)i + uVar11 + 1];
              dVar15 = dVar15 / (pdVar3[uVar11] - dVar1);
              *(double *)(puVar7 + uVar11 * 8) = (pdVar3[uVar11] - u) * dVar15 + dVar16;
              dVar16 = (u - dVar1) * dVar15;
            }
            else {
              *(double *)(puVar7 + uVar11 * 8) = dVar16;
              dVar16 = 0.0;
            }
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        uVar2 = uVar2 + 1;
        uVar9 = uVar9 - 1;
        pdVar3 = pdVar3 + 1;
        puVar7 = puVar7 + 0x40;
      } while (uVar2 != p + 1);
    }
    *ders = local_238[(long)p * 8];
    if (nderiv != 0) {
      uVar9 = p;
      if (nderiv < p) {
        uVar9 = nderiv;
      }
      if (0 < (int)uVar9) {
        uVar2 = 2;
        iVar13 = -1;
        uVar12 = 1;
        uVar11 = 0;
        do {
          local_278 = &local_278 + uVar11 * -8 + (long)p * 8;
          uVar6 = uVar11 * 8 + 0x10;
          __n_00 = 0;
          if (uVar6 <= __n) {
            __n_00 = __n - uVar6;
          }
          local_270 = uVar4;
          memset(local_238 + (uVar11 - 4),0,__n_00);
          memcpy(local_268,local_278,uVar6);
          uVar6 = 1;
          uVar8 = uVar12 & 0xffffffff;
          uVar4 = local_270;
          do {
            dVar14 = 0.0;
            if ((local_268[0] != 0.0) || (NAN(local_268[0]))) {
              dVar14 = local_268[0] / (U[(long)(int)(uVar5 + iVar13) + uVar6] - U[i]);
            }
            if (uVar6 <= uVar12) {
              uVar10 = 0;
              do {
                dVar15 = local_268[uVar10 + 1];
                if ((dVar15 != 0.0) || (NAN(dVar15))) {
                  dVar15 = dVar15 / (U[(long)((int)uVar4 + (int)uVar10) + 1] -
                                    U[(long)i + uVar10 + 1]);
                  dVar14 = (dVar14 - dVar15) * (double)(iVar13 + p + (int)uVar6);
                }
                else {
                  dVar14 = dVar14 * (double)(iVar13 + p + (int)uVar6);
                  dVar15 = 0.0;
                }
                local_268[uVar10] = dVar14;
                uVar10 = uVar10 + 1;
                dVar14 = dVar15;
              } while (uVar8 != uVar10);
            }
            uVar6 = uVar6 + 1;
            uVar8 = (ulong)((int)uVar8 - 1);
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar2);
          ders[uVar12] = local_268[0];
          uVar12 = uVar12 + 1;
          uVar11 = uVar11 + 1;
          uVar2 = uVar2 + 1;
          iVar13 = iVar13 + -1;
          uVar4 = local_270 - 1;
        } while (uVar11 != uVar9);
      }
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
xc_bspline(int i, int p, double u, int nderiv, const double *U, double *ders) {

  /* Initialize output array */
  libxc_memset(ders, 0, (nderiv+1)*sizeof(double));

  /* Check locality of support */
  if(u < U[i] || u >= U[i+p+1]) {
    return;
  }

  /* Arrays need static sizes for stack allocation */
#define PMAX 8
  assert(p<PMAX);

  /* Array of normalized B splines, use dense storage for simpler code */
  double N[PMAX][PMAX];
  libxc_memset(N, 0, PMAX*PMAX*sizeof(double));

  /* Initialize zeroth-degree functions: piecewise constants */
  for(int j=0; j<=p; j++) {
    N[0][j] = (u >= U[i+j] && u < U[i+j+1]) ? 1.0 : 0.0;
  }

  /* Fill out table of B splines */
  for(int k=1; k<=p; k++) {
    double saved = (N[k-1][0] == 0.0) ? 0.0 : ((u-U[i])*N[k-1][0])/(U[i+k]-U[i]);

    for(int j=0; j<=p-k; j++) {
      double Ul = U[i+j+1];
      double Ur = U[i+j+k+1];
      if(N[k-1][j+1] == 0.0) {
        N[k][j] = saved;
        saved = 0.0;
      } else {
        double temp = N[k-1][j+1] / (Ur-Ul);
        N[k][j] = saved + (Ur-u)*temp;
        saved = (u-Ul)*temp;
      }
    }
  }

  /* Function value */
  ders[0] = N[p][0];
  if(nderiv==0)
    return;

  /* Helper memory */
  assert(nderiv<=4);
  double ND[5]; /* dimension nderiv+1 */
  int maxk = (nderiv < p) ? nderiv : p;

  /* Compute derivatives */
  for(int k=1; k<=maxk; k++) {
    /* Load appropriate column */
    libxc_memset(ND, 0, (nderiv+1)*sizeof(double));
    for(int j=0; j<=k; j++)
      ND[j] = N[p-k][j];

    /* Compute table */
    for(int jj=1; jj<=k; jj++) {
      double saved = (ND[0] == 0.0) ? 0.0 : ND[0]/(U[i+p-k+jj]-U[i]);

      for(int j=0; j<=k-jj; j++) {
        double Ul = U[i+j+1];
        /* the -k term is missing in the book */
        double Ur = U[i+j+p-k+jj+1];
        if(ND[j+1] == 0.0) {
          ND[j] = (p-k+jj)*saved;
          saved = 0.0;
        } else {
          double temp = ND[j+1]/(Ur-Ul);
          ND[j] = (p-k+jj)*(saved-temp);
          saved = temp;
        }
      }
    }
    /* k:th derivative is */
    ders[k] = ND[0];
  }
}